

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UnicodeIsException(Unicode61Tokenizer *p,int iCode)

{
  int iVar1;
  int iTest;
  int iHi;
  int iLo;
  int *a;
  int iCode_local;
  Unicode61Tokenizer *p_local;
  
  if (0 < p->nException) {
    iLo = 0;
    iHi = p->nException + -1;
    while (iLo <= iHi) {
      iVar1 = (iHi + iLo) / 2;
      if (iCode == p->aiException[iVar1]) {
        return 1;
      }
      if (p->aiException[iVar1] < iCode) {
        iLo = iVar1 + 1;
      }
      else {
        iHi = iVar1 + -1;
      }
    }
  }
  return 0;
}

Assistant:

static int fts5UnicodeIsException(Unicode61Tokenizer *p, int iCode){
  if( p->nException>0 ){
    int *a = p->aiException;
    int iLo = 0;
    int iHi = p->nException-1;

    while( iHi>=iLo ){
      int iTest = (iHi + iLo) / 2;
      if( iCode==a[iTest] ){
        return 1;
      }else if( iCode>a[iTest] ){
        iLo = iTest+1;
      }else{
        iHi = iTest-1;
      }
    }
  }

  return 0;
}